

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrained_type.cpp
# Opt level: O3

int * test_verifier::verify<int_const&,test_predicate>(int *value,test_predicate *p)

{
  int iVar1;
  bool bVar2;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_c0;
  ITransientExpression local_b0;
  char *local_a0;
  size_t sStack_98;
  undefined1 local_90;
  AssertionHandler local_88;
  StringRef local_40;
  
  local_b0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_b0.m_isBinaryExpression = true;
  local_b0.m_result = false;
  local_b0._10_6_ = 0;
  local_c0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/constrained_type.cpp"
  ;
  local_c0.line = 0x12;
  Catch::StringRef::StringRef(&local_40,"p(value) == expected");
  Catch::AssertionHandler::AssertionHandler
            (&local_88,(StringRef *)&local_b0,&local_c0,local_40,Normal);
  bVar2 = expected;
  iVar1 = *value;
  Catch::StringRef::StringRef((StringRef *)&local_c0,"==");
  local_b0._10_1_ = iVar1 != -1;
  local_b0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f708;
  local_b0.m_result = bVar2 == (iVar1 != -1);
  local_b0.m_isBinaryExpression = true;
  local_a0 = local_c0.file;
  sStack_98 = local_c0.line;
  local_90 = bVar2;
  Catch::AssertionHandler::handleExpr(&local_88,&local_b0);
  Catch::ITransientExpression::~ITransientExpression(&local_b0);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return value;
}

Assistant:

static T&& verify(T&& value, const Predicate& p)
    {
        REQUIRE(p(value) == expected);
        return std::forward<T>(value);
    }